

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractDOMParser::setValidationScheme(AbstractDOMParser *this,ValSchemes newScheme)

{
  XMLScanner *pXVar1;
  bool bVar2;
  
  pXVar1 = this->fScanner;
  if (newScheme != Val_Never) {
    if (newScheme == Val_Always) {
      bVar2 = true;
      goto LAB_002d4714;
    }
    newScheme = Val_Auto;
  }
  bVar2 = false;
LAB_002d4714:
  pXVar1->fValScheme = newScheme;
  pXVar1->fValidate = bVar2;
  return;
}

Assistant:

void AbstractDOMParser::setValidationScheme(const ValSchemes newScheme)
{
    if (newScheme == Val_Never)
        fScanner->setValidationScheme(XMLScanner::Val_Never);
    else if (newScheme == Val_Always)
        fScanner->setValidationScheme(XMLScanner::Val_Always);
    else
        fScanner->setValidationScheme(XMLScanner::Val_Auto);
}